

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentList * __thiscall
ON_SubDComponentList::operator=(ON_SubDComponentList *this,ON_SubDComponentList *src)

{
  ON_SubDComponentList *src_local;
  ON_SubDComponentList *this_local;
  
  if (this != src) {
    this->m_subd_runtime_serial_number = src->m_subd_runtime_serial_number;
    this->m_subd_geometry_content_serial_number = src->m_subd_geometry_content_serial_number;
    this->m_subd_render_content_serial_number = src->m_subd_render_content_serial_number;
    this->m_subd_vertex_count = src->m_subd_vertex_count;
    this->m_subd_edge_count = src->m_subd_edge_count;
    this->m_subd_face_count = src->m_subd_face_count;
    ON_SimpleArray<ON_SubDComponentPtr>::operator=(&this->m_component_list,&src->m_component_list);
    ON_SubD::ShareDimple(&this->m_subd,&src->m_subd);
  }
  return this;
}

Assistant:

ON_SubDComponentList& ON_SubDComponentList::operator=(const ON_SubDComponentList& src)
{
  if (this != &src)
  {
    m_subd_runtime_serial_number = src.m_subd_runtime_serial_number;
    m_subd_geometry_content_serial_number = src.m_subd_geometry_content_serial_number;
    m_subd_render_content_serial_number = src.m_subd_render_content_serial_number;
    m_subd_vertex_count = src.m_subd_vertex_count;
    m_subd_edge_count = src.m_subd_edge_count;
    m_subd_face_count = src.m_subd_face_count;
    m_component_list = src.m_component_list;
    m_subd.ShareDimple(src.m_subd);
  }
  return *this;
}